

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *
wasm::WATParser::anon_unknown_0::str
          (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  LexIntResult *pLVar4;
  OverflowBehavior in_R8D;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  string_view sVar7;
  undefined1 local_350 [7];
  uint8_t c;
  undefined1 auStack_328 [8];
  LexIntResult lexed_1;
  undefined1 local_2f8 [8];
  LexIntCtx ictx;
  undefined1 local_2b0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  undefined1 local_1c8 [8];
  LexStrCtx ctx;
  string_view in_local;
  
  ctx.escapeBuilder.
  super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._392_8_ = in._M_len;
  LexStrCtx::LexStrCtx((LexStrCtx *)local_1c8,in);
  bVar5 = sv("\"",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
  if (bVar1) {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      bVar5 = sv("\"",1);
                      bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        LexStrCtx::lexed(__return_storage_ptr__,(LexStrCtx *)local_1c8);
                        goto LAB_0231d383;
                      }
                      bVar1 = LexCtx::empty((LexCtx *)local_1c8);
                      if (bVar1) {
                        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
                        optional(__return_storage_ptr__);
                        goto LAB_0231d383;
                      }
                      bVar5 = sv("\\",1);
                      sVar3 = LexCtx::startsWith((LexCtx *)local_1c8,bVar5);
                      if (sVar3 != 0) break;
                      bVar2 = LexCtx::peek((LexCtx *)local_1c8);
                      if ((bVar2 < 0x20) || (bVar2 == 0x7f)) {
                        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
                        optional(__return_storage_ptr__);
                        goto LAB_0231d383;
                      }
                      LexStrCtx::takeChar((LexStrCtx *)local_1c8);
                    }
                    LexStrCtx::ensureBuildingEscaped((LexStrCtx *)local_1c8);
                    LexCtx::take((LexCtx *)local_1c8,1);
                    bVar5 = sv("t",1);
                    bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
                    if (!bVar1) break;
                    LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\t');
                  }
                  bVar5 = sv("n",1);
                  bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
                  if (!bVar1) break;
                  LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\n');
                }
                bVar5 = sv("r",1);
                bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
                if (!bVar1) break;
                LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\r');
              }
              bVar5 = sv("\\",1);
              bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
              if (!bVar1) break;
              LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\\');
            }
            bVar5 = sv("\"",1);
            bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
            if (!bVar1) break;
            LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\"');
          }
          bVar5 = sv("\'",1);
          bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,bVar5);
          if (!bVar1) break;
          LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,'\'');
        }
        join_0x00000010_0x00000000_ = sv("u{",2);
        bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,join_0x00000010_0x00000000_);
        if (bVar1) break;
        sVar7 = LexCtx::next((LexCtx *)local_1c8);
        lexed_1._24_8_ = sVar7._M_len;
        LexIntCtx::LexIntCtx((LexIntCtx *)local_2f8,sVar7);
        bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_2f8);
        if ((!bVar1) || (bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_2f8), !bVar1)) {
          std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
                    (__return_storage_ptr__);
          goto LAB_0231d383;
        }
        LexIntCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_350
                         ,(LexIntCtx *)local_2f8);
        pLVar4 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                            local_350);
        auStack_328 = (undefined1  [8])(pLVar4->super_LexResult).span._M_len;
        lexed_1.super_LexResult.span._M_len = (size_t)(pLVar4->super_LexResult).span._M_str;
        lexed_1.super_LexResult.span._M_str = (char *)pLVar4->n;
        lexed_1.n = *(uint64_t *)&pLVar4->sign;
        LexCtx::take((LexCtx *)local_1c8,(LexResult *)auStack_328);
        LexStrCtx::appendEscaped((LexStrCtx *)local_1c8,(char)lexed_1.super_LexResult.span._M_str);
      }
      sVar6 = LexCtx::next((LexCtx *)local_1c8);
      sVar7._M_len = sVar6._M_str;
      sVar7._M_str = (char *)0x0;
      hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_2b0,
             (anon_unknown_0 *)sVar6._M_len,sVar7,in_R8D);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_2b0);
      if (!bVar1) {
        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
                  (__return_storage_ptr__);
        goto LAB_0231d383;
      }
      pLVar4 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                          local_2b0);
      LexCtx::take((LexCtx *)local_1c8,&pLVar4->super_LexResult);
      join_0x00000010_0x00000000_ = sv("}",1);
      bVar1 = LexCtx::takePrefix((LexCtx *)local_1c8,join_0x00000010_0x00000000_);
      if (!bVar1) {
        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
                  (__return_storage_ptr__);
        goto LAB_0231d383;
      }
      pLVar4 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                          local_2b0);
      bVar1 = LexStrCtx::appendUnicode((LexStrCtx *)local_1c8,pLVar4->n);
    } while (bVar1);
    std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
              (__return_storage_ptr__);
  }
  else {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
              (__return_storage_ptr__);
  }
LAB_0231d383:
  LexStrCtx::~LexStrCtx((LexStrCtx *)local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexStrResult> str(std::string_view in) {
  LexStrCtx ctx(in);
  if (!ctx.takePrefix("\""sv)) {
    return {};
  }
  while (!ctx.takePrefix("\""sv)) {
    if (ctx.empty()) {
      // TODO: Add error production for unterminated string.
      return {};
    }
    if (ctx.startsWith("\\"sv)) {
      // Escape sequences
      ctx.ensureBuildingEscaped();
      ctx.take(1);
      if (ctx.takePrefix("t"sv)) {
        ctx.appendEscaped('\t');
      } else if (ctx.takePrefix("n"sv)) {
        ctx.appendEscaped('\n');
      } else if (ctx.takePrefix("r"sv)) {
        ctx.appendEscaped('\r');
      } else if (ctx.takePrefix("\\"sv)) {
        ctx.appendEscaped('\\');
      } else if (ctx.takePrefix("\""sv)) {
        ctx.appendEscaped('"');
      } else if (ctx.takePrefix("'"sv)) {
        ctx.appendEscaped('\'');
      } else if (ctx.takePrefix("u{"sv)) {
        auto lexed = hexnum(ctx.next());
        if (!lexed) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        ctx.take(*lexed);
        if (!ctx.takePrefix("}"sv)) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        if (!ctx.appendUnicode(lexed->n)) {
          // TODO: Add error production for invalid unicode values.
          return {};
        }
      } else {
        LexIntCtx ictx(ctx.next());
        if (!ictx.takeHexdigit() || !ictx.takeHexdigit()) {
          // TODO: Add error production for unrecognized escape sequence.
          return {};
        }
        auto lexed = *ictx.lexed();
        ctx.take(lexed);
        ctx.appendEscaped(char(lexed.n));
      }
    } else {
      // Normal characters
      if (uint8_t c = ctx.peek(); c >= 0x20 && c != 0x7F) {
        ctx.takeChar();
      } else {
        // TODO: Add error production for unescaped control characters.
        return {};
      }
    }
  }
  return ctx.lexed();
}